

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall
QMenuPrivate::copyActionToPlatformItem(QMenuPrivate *this,QAction *action,QPlatformMenuItem *item)

{
  byte bVar1;
  undefined4 uVar2;
  ulong uVar3;
  QWidget *pQVar4;
  QStyle *pQVar5;
  long lVar6;
  QMenu *pQVar7;
  QPlatformMenu *pQVar8;
  long *in_RDX;
  long in_FS_OFFSET;
  QWidget *w;
  QStyleOption opt_1;
  QStyleOption opt;
  QWidget *in_stack_fffffffffffffe88;
  QStyleOption *in_stack_fffffffffffffe90;
  QWidget *in_stack_fffffffffffffea0;
  long *plVar9;
  QStyleOption *in_stack_fffffffffffffea8;
  byte local_121;
  QKeySequence local_c8 [8];
  QIcon local_c0;
  QIcon local_b8;
  undefined1 local_b0 [24];
  QFont local_98 [16];
  undefined1 local_88 [64];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAction::text();
  (**(code **)(*in_RDX + 0x70))(in_RDX,local_b0);
  QString::~QString((QString *)0x63eee9);
  bVar1 = QAction::isSeparator();
  (**(code **)(*in_RDX + 0x90))(in_RDX,bVar1 & 1);
  uVar3 = QAction::isIconVisibleInMenu();
  if ((uVar3 & 1) == 0) {
    QIcon::QIcon(&local_c0);
    (**(code **)(*in_RDX + 0x78))(in_RDX,&local_c0);
    QIcon::~QIcon(&local_c0);
  }
  else {
    QAction::icon();
    (**(code **)(*in_RDX + 0x78))(in_RDX,&local_b8);
    QIcon::~QIcon(&local_b8);
    pQVar4 = getParentWidget((QAction *)in_stack_fffffffffffffe90);
    if (pQVar4 == (QWidget *)0x0) {
      memset(local_88,0xaa,0x40);
      QStyleOption::QStyleOption
                (in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                 (int)in_stack_fffffffffffffea0);
      pQVar5 = QApplication::style();
      uVar2 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x3e,local_88,0);
      (**(code **)(*in_RDX + 200))(in_RDX,uVar2);
      QStyleOption::~QStyleOption(in_stack_fffffffffffffe90);
    }
    else {
      memset(local_48,0xaa,0x40);
      QStyleOption::QStyleOption
                (in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                 (int)in_stack_fffffffffffffea0);
      QStyleOption::initFrom(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      pQVar5 = QWidget::style(in_stack_fffffffffffffe88);
      uVar2 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x3e,local_48,pQVar4);
      (**(code **)(*in_RDX + 200))(in_RDX,uVar2);
      QStyleOption::~QStyleOption(in_stack_fffffffffffffe90);
    }
  }
  bVar1 = QAction::isVisible();
  (**(code **)(*in_RDX + 0x88))(in_RDX,bVar1 & 1);
  QAction::shortcut();
  (**(code **)(*in_RDX + 0xb8))(in_RDX,local_c8);
  QKeySequence::~QKeySequence(local_c8);
  bVar1 = QAction::isCheckable();
  (**(code **)(*in_RDX + 0xa8))(in_RDX,bVar1 & 1);
  bVar1 = QAction::isChecked();
  (**(code **)(*in_RDX + 0xb0))(in_RDX,bVar1 & 1);
  lVar6 = QAction::actionGroup();
  local_121 = 0;
  if (lVar6 != 0) {
    QAction::actionGroup();
    local_121 = QActionGroup::isExclusive();
  }
  (**(code **)(*in_RDX + 0xd8))(in_RDX,local_121 & 1);
  QAction::font();
  (**(code **)(*in_RDX + 0x98))(in_RDX,local_98);
  QFont::~QFont(local_98);
  plVar9 = in_RDX;
  uVar2 = QAction::menuRole();
  (**(code **)(*plVar9 + 0xa0))(plVar9,uVar2);
  plVar9 = in_RDX;
  bVar1 = QAction::isEnabled();
  (**(code **)(*plVar9 + 0xc0))(plVar9,bVar1 & 1);
  pQVar7 = QAction::menu<QMenu*>((QAction *)0x63f2d3);
  if (pQVar7 == (QMenu *)0x0) {
    (**(code **)(*in_RDX + 0x80))(in_RDX,0);
  }
  else {
    QAction::menu<QMenu*>((QAction *)0x63f2ea);
    pQVar8 = QMenu::platformMenu((QMenu *)0x63f2f2);
    if (pQVar8 == (QPlatformMenu *)0x0) {
      pQVar7 = QAction::menu<QMenu*>((QAction *)0x63f305);
      pQVar8 = QPointer<QPlatformMenu>::operator->((QPointer<QPlatformMenu> *)0x63f31b);
      (**(code **)(*(long *)pQVar8 + 0xf8))();
      QMenu::setPlatformMenu(pQVar7,(QPlatformMenu *)in_stack_fffffffffffffe88);
    }
    QAction::menu<QMenu*>((QAction *)0x63f34d);
    pQVar8 = QMenu::platformMenu((QMenu *)0x63f355);
    (**(code **)(*in_RDX + 0x80))(in_RDX,pQVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::copyActionToPlatformItem(const QAction *action, QPlatformMenuItem *item)
{
    item->setText(action->text());
    item->setIsSeparator(action->isSeparator());
    if (action->isIconVisibleInMenu()) {
        item->setIcon(action->icon());
        if (QWidget *w = getParentWidget(action)) {
            QStyleOption opt;
            opt.initFrom(w);
            item->setIconSize(w->style()->pixelMetric(QStyle::PM_SmallIconSize, &opt, w));
        } else {
            QStyleOption opt;
            item->setIconSize(QApplication::style()->pixelMetric(QStyle::PM_SmallIconSize, &opt, nullptr));
        }
    } else {
        item->setIcon(QIcon());
    }
    item->setVisible(action->isVisible());
#if QT_CONFIG(shortcut)
    item->setShortcut(action->shortcut());
#endif
    item->setCheckable(action->isCheckable());
    item->setChecked(action->isChecked());
    item->setHasExclusiveGroup(action->actionGroup() && action->actionGroup()->isExclusive());
    item->setFont(action->font());
    item->setRole((QPlatformMenuItem::MenuRole) action->menuRole());
    item->setEnabled(action->isEnabled());

    if (action->menu()) {
        if (!action->menu()->platformMenu())
            action->menu()->setPlatformMenu(platformMenu->createSubMenu());
        item->setMenu(action->menu()->platformMenu());
    } else {
        item->setMenu(nullptr);
    }
}